

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDateTime __thiscall QDate::startOfDay(QDate *this,QTimeZone *zone)

{
  char16_t **this_00;
  long lVar1;
  ulong uVar2;
  QDateTime QVar3;
  bool bVar4;
  QTime time;
  Data DVar5;
  QDate QVar6;
  Data DVar7;
  Data DVar8;
  Data DVar9;
  Data DVar10;
  ulong uVar11;
  Data DVar12;
  QDate QVar13;
  time_t tVar14;
  Data DVar15;
  QDate QVar16;
  Data DVar17;
  Data DVar18;
  QTimeZone *in_RDX;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  Data local_b8;
  QTime local_b0;
  QTime local_ac;
  QDateTime when;
  QTime local_9c;
  QDateTime probe_1;
  QTime local_8c;
  QTime local_88;
  QTime local_84;
  QDateTime probe;
  QTime local_74;
  QDateTime when_1;
  OffsetData tran;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1 *)0x31b5d43afe < (undefined1 *)((long)&(zone->d).d[0x9f11b8cc].m_id.d.d + 3U)) ||
     (bVar4 = QTimeZone::isValid(in_RDX), !bVar4)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      QDateTime::QDateTime((QDateTime *)this);
      return (QDateTime)(Data)this;
    }
    goto LAB_0030aedf;
  }
  when.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QVar6.jd = *(qint64 *)&(zone->d).s;
  QTime::QTime(&local_ac,0,0,0,0);
  QDateTime::QDateTime(&when,QVar6,local_ac,in_RDX,LegacyBehavior);
  DVar5 = when.d;
  if (((ulong)when.d & 1) == 0) {
    DVar5._4_4_ = 0;
    DVar5._0_4_ = *(uint *)((long)when.d + 4);
  }
  if ((((ulong)DVar5.d & 8) == 0) ||
     (QVar6 = QDateTime::date(&when), (QTimeZonePrivate *)QVar6.jd != (zone->d).d)) {
    if (((-*(int *)&in_RDX->d & 3U) != 0) || (bVar4 = QTimeZone::hasTransitions(in_RDX), !bVar4)) {
LAB_0030aa9f:
      QVar6.jd = (qint64)(zone->d).d;
      this_00 = &tran.abbreviation.d.ptr;
      tran.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      tran.abbreviation.d.d = (Data *)QVar6.jd;
      QTimeZone::QTimeZone((QTimeZone *)this_00,in_RDX);
      when_1.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
      QTime::QTime(&local_74,2,0,0,0);
      QVar16.jd = (qint64)tran.abbreviation.d.d;
      QDateTime::QDateTime
                (&when_1,(QDate)tran.abbreviation.d.d,local_74,(QTimeZone *)this_00,Reject);
      DVar8 = when_1.d;
      if (((ulong)when_1.d & 1) == 0) {
        DVar8._4_4_ = 0;
        DVar8._0_4_ = *(uint *)((long)when_1.d + 4);
      }
      if (((ulong)DVar8.d & 8) == 0) {
        QTime::QTime(&local_84,0xc,0,0,0);
        QVar16.jd = (qint64)tran.abbreviation.d.d;
        QDateTime::QDateTime
                  (&probe,(QDate)tran.abbreviation.d.d,local_84,(QTimeZone *)this_00,Reject);
        QVar3 = when_1;
        when_1 = probe;
        probe = QVar3;
        QDateTime::~QDateTime(&probe);
        DVar9 = when_1.d;
        if (((ulong)when_1.d & 1) == 0) {
          DVar9._4_4_ = 0;
          DVar9._0_4_ = *(uint *)((long)when_1.d + 4);
        }
        if (((ulong)DVar9.d & 8) != 0) goto LAB_0030abd0;
        QTime::QTime(&local_88,0x17,0x3b,0x3b,999);
        QVar16.jd = (qint64)tran.abbreviation.d.d;
        QDateTime::QDateTime
                  (&probe,(QDate)tran.abbreviation.d.d,local_88,
                   (QTimeZone *)&tran.abbreviation.d.ptr,Reject);
        QVar3 = when_1;
        when_1 = probe;
        probe = QVar3;
        QDateTime::~QDateTime(&probe);
        DVar10 = when_1.d;
        if (((ulong)when_1.d & 1) == 0) {
          DVar10._4_4_ = 0;
          DVar10._0_4_ = *(uint *)((long)when_1.d + 4);
        }
        if (((ulong)DVar10.d & 8) != 0) goto LAB_0030abd0;
LAB_0030ad18:
        QDateTime::QDateTime((QDateTime *)&local_b8.data);
      }
      else {
LAB_0030abd0:
        uVar11 = QDateTime::time(&when_1,(time_t *)QVar16.jd);
        uVar11 = (long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) / 60000 &
                 0xffffffff;
        iVar20 = 0;
        while( true ) {
          iVar22 = (int)uVar11;
          if (iVar22 <= iVar20 + 1) break;
          uVar2 = (long)(iVar20 + iVar22) / 2;
          uVar23 = uVar2 & 0xffffffff;
          probe.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
          iVar21 = (int)uVar2;
          QTime::QTime(&local_8c,(iVar20 + iVar22) / 0x78,
                       (int)((long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | uVar23) % 0x3c),0,0);
          QVar16.jd = QVar6.jd;
          QDateTime::QDateTime((QDateTime *)&probe.d.data,QVar6,local_8c,in_RDX,PreferBefore);
          DVar12 = probe.d;
          if (((ulong)probe.d & 1) == 0) {
            DVar12._4_4_ = 0;
            DVar12._0_4_ = *(uint *)((long)probe.d + 4);
          }
          if ((((ulong)DVar12.d & 8) != 0) &&
             (QVar13 = QDateTime::date((QDateTime *)&probe.d.data), QVar13.jd == QVar6.jd)) {
            QVar16.jd = (qint64)&probe.d;
            QDateTime::Data::operator=((Data *)&when_1,&probe.d);
            uVar11 = uVar23;
            iVar21 = iVar20;
          }
          iVar20 = iVar21;
          QDateTime::~QDateTime((QDateTime *)&probe.d.data);
        }
        probe.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
        tVar14 = QDateTime::time(&when_1,(time_t *)QVar16.jd);
        probe_1.d._0_4_ = (int)tVar14;
        time = QTime::addMSecs((QTime *)&probe_1,-1000);
        QDateTime::QDateTime
                  (&probe,(QDate)tran.abbreviation.d.d,time,(QTimeZone *)&tran.abbreviation.d.ptr,
                   Reject);
        DVar15 = probe.d;
        if (((ulong)probe.d & 1) == 0) {
          DVar15._4_4_ = 0;
          DVar15._0_4_ = *(uint *)((long)probe.d + 4);
        }
        if ((((ulong)DVar15.d & 8) != 0) &&
           (QVar16 = QDateTime::date(&probe), QVar16.jd == QVar6.jd)) {
          iVar22 = iVar22 * 0x3c;
          iVar20 = iVar20 * 0x3c;
          while (iVar20 + 1 < iVar22) {
            iVar21 = iVar22 + iVar20;
            iVar19 = (int)((long)iVar21 / 2);
            probe_1.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
            QTime::QTime(&local_9c,iVar21 / 0x1c20,
                         (int)((long)((ulong)(uint)((int)((long)iVar21 / 0x78) >> 0x1f) << 0x20 |
                                     (long)iVar21 / 0x78 & 0xffffffffU) % 0x3c),
                         (int)((long)((ulong)(uint)(iVar19 >> 0x1f) << 0x20 |
                                     (long)iVar21 / 2 & 0xffffffffU) % 0x3c),0);
            QDateTime::QDateTime
                      ((QDateTime *)&probe_1.d.data,(QDate)tran.abbreviation.d.d,local_9c,
                       (QTimeZone *)&tran.abbreviation.d.ptr,Reject);
            DVar18 = probe_1.d;
            if (((ulong)probe_1.d & 1) == 0) {
              DVar18._4_4_ = 0;
              DVar18._0_4_ = *(uint *)((long)probe_1.d + 4);
            }
            iVar21 = iVar19;
            if ((((ulong)DVar18.d & 8) != 0) &&
               (QVar16 = QDateTime::date((QDateTime *)&probe_1.d.data), QVar16.jd == QVar6.jd)) {
              QDateTime::Data::operator=((Data *)&when_1,&probe_1.d);
              iVar21 = iVar20;
              iVar22 = iVar19;
            }
            iVar20 = iVar21;
            QDateTime::~QDateTime((QDateTime *)&probe_1.d.data);
          }
        }
        QDateTime::~QDateTime(&probe);
        DVar17 = when_1.d;
        if (((ulong)when_1.d & 1) == 0) {
          DVar17._4_4_ = 0;
          DVar17._0_4_ = *(uint *)((long)when_1.d + 4);
        }
        if (((ulong)DVar17.d & 8) == 0) goto LAB_0030ad18;
        QDateTime::QDateTime((QDateTime *)&local_b8.data,&when_1);
      }
      QDateTime::~QDateTime(&when_1);
      QTimeZone::~QTimeZone((QTimeZone *)&tran.abbreviation.d.ptr);
      QVar3 = when;
      when.d = (Data)(Data)local_b8.data;
      local_b8 = QVar3.d;
      QDateTime::~QDateTime((QDateTime *)&local_b8.data);
      goto LAB_0030a944;
    }
    tran._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    tran._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    tran.atUtc.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    tran.abbreviation.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QVar6 = addDays((QDate *)zone,1);
    QTime::QTime(&local_b0,0xc,0,0,0);
    QDateTime::QDateTime(&when_1,QVar6,local_b0,in_RDX,LegacyBehavior);
    QTimeZone::previousTransition(&tran,in_RDX,&when_1);
    QDateTime::~QDateTime(&when_1);
    QDateTime::toTimeZone(&when_1,(QTimeZone *)&tran.atUtc);
    DVar7 = when_1.d;
    if (((ulong)when_1.d & 1) == 0) {
      DVar7._4_4_ = 0;
      DVar7._0_4_ = *(uint *)((long)when_1.d + 4);
    }
    if ((((ulong)DVar7.d & 8) == 0) ||
       (QVar6 = QDateTime::date(&when_1), (QTimeZonePrivate *)QVar6.jd != (zone->d).d)) {
      QDateTime::~QDateTime(&when_1);
      QTimeZone::OffsetData::~OffsetData(&tran);
      goto LAB_0030aa9f;
    }
    QDateTime::QDateTime((QDateTime *)this,&when_1);
    QDateTime::~QDateTime(&when_1);
    QTimeZone::OffsetData::~OffsetData(&tran);
  }
  else {
LAB_0030a944:
    QDateTime::QDateTime((QDateTime *)this,&when);
  }
  QDateTime::~QDateTime(&when);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDateTime)(Data)this;
  }
LAB_0030aedf:
  __stack_chk_fail();
}

Assistant:

QDateTime QDate::startOfDay(const QTimeZone &zone) const
{
    if (!inDateTimeRange(jd, DaySide::Start) || !zone.isValid())
        return QDateTime();

    QDateTime when(*this, QTime(0, 0), zone,
                   QDateTime::TransitionResolution::RelativeToBefore);
    if (Q_UNLIKELY(!when.isValid() || when.date() != *this)) {
#if QT_CONFIG(timezone)
        // The start of the day must have fallen in a spring-forward's gap; find the spring-forward:
        if (zone.timeSpec() == Qt::TimeZone && zone.hasTransitions()) {
            QTimeZone::OffsetData tran
                // There's unlikely to be another transition before noon tomorrow.
                // However, the whole of today may have been skipped !
                = zone.previousTransition(QDateTime(addDays(1), QTime(12, 0), zone));
            const QDateTime &at = tran.atUtc.toTimeZone(zone);
            if (at.isValid() && at.date() == *this)
                return at;
        }
#endif

        when = toEarliest(*this, zone);
    }

    return when;
}